

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_analytic_mels.c
# Opt level: O3

int MatrixEmbeddedLSSolve(SUNLinearSolver LS,SUNMatrix A,N_Vector x,N_Vector b,sunrealtype tol)

{
  uint uVar1;
  int iVar2;
  void *user_data;
  sunrealtype gamma;
  sunrealtype tcur;
  N_Vector sdata;
  N_Vector Fi;
  N_Vector zpred;
  N_Vector z;
  
  uVar1 = ARKodeGetNonlinearSystemData(LS->content,&tcur,&zpred,&z,&Fi,&gamma,&sdata,&user_data);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
            "ARKodeGetNonlinearSystemData",(ulong)uVar1);
    iVar2 = -1;
  }
  else {
    **(double **)((long)x->content + 0x10) =
         **(double **)((long)b->content + 0x10) / (1.0 - gamma * *user_data);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int MatrixEmbeddedLSSolve(SUNLinearSolver LS, SUNMatrix A, N_Vector x,
                                 N_Vector b, sunrealtype tol)
{
  /* temporary variables */
  int retval;
  N_Vector z, zpred, Fi, sdata;
  sunrealtype tcur, gamma;
  void* user_data;
  sunrealtype* rdata;
  sunrealtype lambda;

  /* retrieve implicit system data from ARKODE */
  retval = ARKodeGetNonlinearSystemData(LS->content, &tcur, &zpred, &z, &Fi,
                                        &gamma, &sdata, &user_data);
  if (check_retval((void*)&retval, "ARKodeGetNonlinearSystemData", 1))
  {
    return (-1);
  }

  /* extract stiffness parameter from user_data */
  rdata  = (sunrealtype*)user_data;
  lambda = rdata[0];

  /* perform linear solve: (1-gamma*lambda)*x = b */
  NV_Ith_S(x, 0) = NV_Ith_S(b, 0) / (1 - gamma * lambda);

  /* return with success */
  return (SUN_SUCCESS);
}